

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O0

string * __thiscall
Diligent::LinuxFileSystem::GetLocalAppDataDirectory_abi_cxx11_
          (string *__return_storage_ptr__,LinuxFileSystem *this,char *AppName,bool Create)

{
  char *pcVar1;
  bool bVar2;
  __uid_t __uid;
  Char *pCVar3;
  allocator local_2a;
  undefined1 local_29;
  passwd *local_28;
  passwd *pwuid;
  LinuxFileSystem *pLStack_18;
  bool Create_local;
  char *AppName_local;
  string *AppDataDir;
  
  pwuid._7_1_ = (byte)AppName & 1;
  pLStack_18 = this;
  AppName_local = (char *)__return_storage_ptr__;
  __uid = getuid();
  local_28 = getpwuid(__uid);
  local_29 = 0;
  pcVar1 = local_28->pw_dir;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  pCVar3 = (Char *)std::__cxx11::string::back();
  bVar2 = BasicFileSystem::IsSlash(*pCVar3);
  if (!bVar2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".cache");
  if (pLStack_18 == (LinuxFileSystem *)0x0) {
    pLStack_18 = _program_invocation_short_name;
  }
  if (pLStack_18 != (LinuxFileSystem *)0x0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)pLStack_18);
    if ((pwuid._7_1_ & 1) != 0) {
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      bVar2 = PathExists(pCVar3);
      if (!bVar2) {
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        CreateDirectory(pCVar3);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LinuxFileSystem::GetLocalAppDataDirectory(const char* AppName, bool Create)
{
    const auto* pwuid = getpwuid(getuid());
    std::string AppDataDir{pwuid->pw_dir};
    if (!IsSlash(AppDataDir.back()))
        AppDataDir += SlashSymbol;

#    if PLATFORM_APPLE
    AppDataDir += "Library/Caches";
#    else
    AppDataDir += ".cache";
#    endif

    if (AppName == nullptr)
    {
#    ifdef _GNU_SOURCE
        AppName = program_invocation_short_name;
#    elif defined(__APPLE__)
        AppName = getprogname();
#    endif
    }

    if (AppName != nullptr)
    {
        AppDataDir += SlashSymbol;
        AppDataDir += AppName;
        if (Create && !PathExists(AppDataDir.c_str()))
            CreateDirectory(AppDataDir.c_str());
    }
    return AppDataDir;
}